

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

uchar * ensure(printbuffer *p,size_t needed)

{
  ulong uVar1;
  _func_void_ptr_void_ptr_size_t *p_Var2;
  uchar *puVar3;
  ulong uVar4;
  size_t sVar5;
  
  puVar3 = p->buffer;
  if (puVar3 != (uchar *)0x0) {
    uVar1 = p->length;
    if (uVar1 == 0) {
      if (0x7fffffff < needed) {
        return (uchar *)0x0;
      }
    }
    else {
      if (0x7fffffff < needed) {
        return (uchar *)0x0;
      }
      if (uVar1 <= p->offset) {
        return (uchar *)0x0;
      }
    }
    uVar4 = needed + p->offset + 1;
    if (uVar4 <= uVar1) {
      return puVar3 + p->offset;
    }
    if (p->noalloc == 0) {
      if (uVar4 < 0x40000000) {
        sVar5 = uVar4 * 2;
      }
      else {
        sVar5 = 0x7fffffff;
        if (uVar4 >> 0x1f != 0) {
          return (uchar *)0x0;
        }
      }
      p_Var2 = (p->hooks).reallocate;
      if (p_Var2 == (_func_void_ptr_void_ptr_size_t *)0x0) {
        puVar3 = (uchar *)(*(p->hooks).allocate)(sVar5);
        if (puVar3 != (uchar *)0x0) {
          memcpy(puVar3,p->buffer,p->offset + 1);
          (*(p->hooks).deallocate)(p->buffer);
          goto LAB_00106295;
        }
      }
      else {
        puVar3 = (uchar *)(*p_Var2)(puVar3,sVar5);
        if (puVar3 != (uchar *)0x0) {
LAB_00106295:
          p->length = sVar5;
          p->buffer = puVar3;
          return puVar3 + p->offset;
        }
      }
      (*(p->hooks).deallocate)(p->buffer);
      p->buffer = (uchar *)0x0;
      p->length = 0;
    }
  }
  return (uchar *)0x0;
}

Assistant:

static unsigned char* ensure(printbuffer * const p, size_t needed)
{
    unsigned char *newbuffer = NULL;
    size_t newsize = 0;

    if ((p == NULL) || (p->buffer == NULL))
    {
        return NULL;
    }

    if ((p->length > 0) && (p->offset >= p->length))
    {
        /* make sure that offset is valid */
        return NULL;
    }

    if (needed > INT_MAX)
    {
        /* sizes bigger than INT_MAX are currently not supported */
        return NULL;
    }

    needed += p->offset + 1;
    if (needed <= p->length)
    {
        return p->buffer + p->offset;
    }

    if (p->noalloc) {
        return NULL;
    }

    /* calculate new buffer size */
    if (needed > (INT_MAX / 2))
    {
        /* overflow of int, use INT_MAX if possible */
        if (needed <= INT_MAX)
        {
            newsize = INT_MAX;
        }
        else
        {
            return NULL;
        }
    }
    else
    {
        newsize = needed * 2;
    }

    if (p->hooks.reallocate != NULL)
    {
        /* reallocate with realloc if available */
        newbuffer = (unsigned char*)p->hooks.reallocate(p->buffer, newsize);
        if (newbuffer == NULL)
        {
            p->hooks.deallocate(p->buffer);
            p->length = 0;
            p->buffer = NULL;

            return NULL;
        }
    }
    else
    {
        /* otherwise reallocate manually */
        newbuffer = (unsigned char*)p->hooks.allocate(newsize);
        if (!newbuffer)
        {
            p->hooks.deallocate(p->buffer);
            p->length = 0;
            p->buffer = NULL;

            return NULL;
        }

        memcpy(newbuffer, p->buffer, p->offset + 1);
        p->hooks.deallocate(p->buffer);
    }
    p->length = newsize;
    p->buffer = newbuffer;

    return newbuffer + p->offset;
}